

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O2

void Gia_ManAigPrintPiLevels(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int i;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj;
  int v;
  int nCapMin;
  long lVar5;
  
  for (v = 0; v < p->vCis->nSize - p->nRegs; v = v + 1) {
    pObj = Gia_ManCi(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    i = Gia_ObjId(p,pObj);
    p_00 = p->vLevels;
    iVar3 = p_00->nSize;
    if (iVar3 <= i) {
      iVar1 = i + 1;
      iVar2 = p_00->nCap * 2;
      nCapMin = iVar1;
      if ((iVar2 <= i) || (nCapMin = iVar2, p_00->nCap <= i)) {
        Vec_IntGrow(p_00,nCapMin);
        iVar3 = p_00->nSize;
      }
      for (lVar5 = (long)iVar3; lVar5 < iVar1; lVar5 = lVar5 + 1) {
        p_00->pArray[lVar5] = 0;
      }
      p_00->nSize = iVar1;
    }
    uVar4 = Vec_IntEntry(p_00,i);
    printf("%d ",(ulong)uVar4);
  }
  putchar(10);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Synthesis script.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManAigPrintPiLevels( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPi( p, pObj, i )
        printf( "%d ", Gia_ObjLevel(p, pObj) );
    printf( "\n" );
}